

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_iCCP(png_const_structrp png_ptr,png_inforp info_ptr,png_charpp name,int *compression_type,
            png_bytepp profile,png_uint_32 *proflen)

{
  uint uVar1;
  uint *puVar2;
  png_uint_32 pVar3;
  
  pVar3 = 0;
  if ((((info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
       (proflen != (png_uint_32 *)0x0)) && (profile != (png_bytepp)0x0)) &&
     ((name != (png_charpp)0x0 && ((info_ptr->valid & 0x1000) != 0)))) {
    *name = info_ptr->iccp_name;
    puVar2 = (uint *)info_ptr->iccp_profile;
    *profile = (png_byte *)puVar2;
    uVar1 = *puVar2;
    *proflen = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    pVar3 = 0x1000;
    if (compression_type != (int *)0x0) {
      *compression_type = 0;
    }
  }
  return pVar3;
}

Assistant:

png_uint_32 PNGAPI
png_get_iCCP(png_const_structrp png_ptr, png_inforp info_ptr,
    png_charpp name, int *compression_type,
    png_bytepp profile, png_uint_32 *proflen)
{
   png_debug1(1, "in %s retrieval function", "iCCP");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_iCCP) != 0 &&
       name != NULL && profile != NULL && proflen != NULL)
   {
      *name = info_ptr->iccp_name;
      *profile = info_ptr->iccp_profile;
      *proflen = png_get_uint_32(info_ptr->iccp_profile);
      /* This is somewhat irrelevant since the profile data returned has
       * actually been uncompressed.
       */
      if (compression_type != NULL)
         *compression_type = PNG_COMPRESSION_TYPE_BASE;
      return PNG_INFO_iCCP;
   }

   return 0;

}